

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_delay.c
# Opt level: O1

void d_delay_setup(void)

{
  t_symbol *ptVar1;
  _class *p_Var2;
  
  ptVar1 = gensym("delwrite~");
  sigdelwrite_class = class_new(ptVar1,sigdelwrite_new,sigdelwrite_free,0x68,0,A_DEFSYM,6,0);
  class_domainsignalin(sigdelwrite_class,100);
  p_Var2 = sigdelwrite_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,sigdelwrite_dsp,ptVar1,A_CANT);
  p_Var2 = sigdelwrite_class;
  ptVar1 = gensym("clear");
  class_addmethod(p_Var2,sigdelwrite_clear,ptVar1,A_NULL);
  p_Var2 = sigdelwrite_class;
  ptVar1 = gensym("delay-tilde-objects");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("delread~");
  p_Var2 = class_new(ptVar1,sigdelread_new,(t_method)0x0,0x50,0,A_DEFSYM,6,0);
  sigdelread_class = p_Var2;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,sigdelread_dsp,ptVar1,A_CANT);
  class_doaddfloat(sigdelread_class,sigdelread_float);
  p_Var2 = sigdelread_class;
  ptVar1 = gensym("delay-tilde-objects");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("delread4~");
  sigvd_class = class_new(ptVar1,sigvd_new,(t_method)0x0,0x48,0,A_DEFSYM,0);
  ptVar1 = gensym("vd~");
  class_addcreator(sigvd_new,ptVar1,A_DEFSYM,0);
  p_Var2 = sigvd_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,sigvd_dsp,ptVar1,A_CANT,0);
  class_domainsignalin(sigvd_class,0x40);
  p_Var2 = sigvd_class;
  ptVar1 = gensym("delay-tilde-objects");
  class_sethelpsymbol(p_Var2,ptVar1);
  return;
}

Assistant:

static void sigdelwrite_setup(void)
{
    sigdelwrite_class = class_new(gensym("delwrite~"),
        (t_newmethod)sigdelwrite_new, (t_method)sigdelwrite_free,
        sizeof(t_sigdelwrite), 0, A_DEFSYM, A_DEFFLOAT, 0);
    CLASS_MAINSIGNALIN(sigdelwrite_class, t_sigdelwrite, x_f);
    class_addmethod(sigdelwrite_class, (t_method)sigdelwrite_dsp,
        gensym("dsp"), A_CANT, 0);
    class_addmethod(sigdelwrite_class, (t_method)sigdelwrite_clear,
                    gensym("clear"), 0);
    class_sethelpsymbol(sigdelwrite_class, gensym("delay-tilde-objects"));
}